

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::vposition(Fl_Tree *this,int pos)

{
  double dVar1;
  Fl_Scrollbar *this_00;
  int p;
  int iVar2;
  
  iVar2 = 0;
  if (0 < pos) {
    iVar2 = pos;
  }
  this_00 = this->_vscroll;
  dVar1 = (this_00->super_Fl_Slider).super_Fl_Valuator.max;
  p = (int)dVar1;
  if ((double)iVar2 <= dVar1) {
    p = iVar2;
  }
  if (p == (int)(this_00->super_Fl_Slider).super_Fl_Valuator.value_) {
    return;
  }
  Fl_Scrollbar::value(this_00,p);
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Tree::vposition(int pos) {
  if (pos < 0) pos = 0;
  if (pos > _vscroll->maximum()) pos = (int)_vscroll->maximum();
  if (pos == _vscroll->value()) return;
  _vscroll->value(pos);
  redraw();
}